

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_function.cpp
# Opt level: O2

char * prototype_string(glsl_type *return_type,char *name,exec_list *parameters)

{
  char *pcVar1;
  char *str;
  char *local_28;
  
  local_28 = (char *)0x0;
  if (return_type != (glsl_type *)0x0) {
    local_28 = ralloc_asprintf((void *)0x0,"%s ",return_type->name);
  }
  ralloc_asprintf_append(&local_28,"%s(",name);
  pcVar1 = "";
  while (parameters = (exec_list *)(parameters->head_sentinel).next,
        (parameters->head_sentinel).next != (exec_node *)0x0) {
    ralloc_asprintf_append(&local_28,"%s%s",pcVar1,(parameters->tail_sentinel).prev[1].next);
    pcVar1 = ", ";
  }
  ralloc_strcat(&local_28,")");
  return local_28;
}

Assistant:

char *
prototype_string(const glsl_type *return_type, const char *name,
                 exec_list *parameters)
{
   char *str = NULL;

   if (return_type != NULL)
      str = ralloc_asprintf(NULL, "%s ", return_type->name);

   ralloc_asprintf_append(&str, "%s(", name);

   const char *comma = "";
   foreach_in_list(const ir_variable, param, parameters) {
      ralloc_asprintf_append(&str, "%s%s", comma, param->type->name);
      comma = ", ";
   }

   ralloc_strcat(&str, ")");
   return str;
}